

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  stbi_uc *psVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  stbi_uc sVar16;
  stbi_uc *psVar17;
  int iVar18;
  long lVar19;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_001322d1:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    do {
      iVar7 = 0x161290;
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar10 = a->num_bits;
      uVar6 = a->code_buffer;
      a->code_buffer = uVar6 >> 1;
      a->num_bits = iVar10 + -1;
      if (iVar10 < 3) {
        stbi__fill_bits(a);
      }
      iVar10 = a->num_bits;
      uVar8 = a->code_buffer;
      a->code_buffer = uVar8 >> 2;
      uVar14 = iVar10 - 2;
      a->num_bits = uVar14;
      iVar18 = 0;
      switch(uVar8 & 3) {
      case 0:
        uVar14 = uVar14 & 7;
        if (uVar14 != 0) {
          stbi__zreceive(a,uVar14);
        }
        iVar7 = a->num_bits;
        if (iVar7 < 1) {
          uVar12 = 0;
        }
        else {
          uVar14 = a->code_buffer;
          uVar12 = 0;
          iVar10 = iVar7;
          do {
            *(char *)((long)local_814.fast + uVar12) = (char)uVar14;
            uVar12 = uVar12 + 1;
            uVar14 = uVar14 >> 8;
            iVar7 = iVar10 + -8;
            bVar5 = 8 < iVar10;
            iVar10 = iVar7;
          } while (bVar5);
          a->code_buffer = uVar14;
          a->num_bits = iVar7;
        }
        if (iVar7 < 0) {
LAB_0013289d:
          pcVar11 = "zlib corrupt";
        }
        else {
          if ((uint)uVar12 < 4) {
            psVar17 = a->zbuffer;
            psVar4 = a->zbuffer_end;
            uVar12 = uVar12 & 0xffffffff;
            do {
              if (psVar17 < psVar4) {
                a->zbuffer = psVar17 + 1;
                sVar16 = *psVar17;
                psVar17 = psVar17 + 1;
              }
              else {
                sVar16 = '\0';
              }
              *(stbi_uc *)((long)local_814.fast + uVar12) = sVar16;
              uVar12 = uVar12 + 1;
            } while (uVar12 != 4);
          }
          if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_0013289d;
          uVar12 = (ulong)local_814.fast[0];
          if (a->zbuffer + uVar12 <= a->zbuffer_end) {
            if ((a->zout + uVar12 <= a->zout_end) ||
               (iVar7 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar7 != 0)) {
              memcpy(a->zout,a->zbuffer,uVar12);
              a->zbuffer = a->zbuffer + uVar12;
              a->zout = a->zout + uVar12;
              goto LAB_0013286f;
            }
            goto LAB_001322a4;
          }
          pcVar11 = "read past buffer";
        }
        goto LAB_0013229b;
      case 1:
        iVar10 = stbi__zbuild_huffman
                           (z,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar10 == 0) {
          return 0;
        }
        psVar17 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar18 = 0x20;
        break;
      case 2:
        if (iVar10 < 7) {
          stbi__fill_bits(a);
        }
        iVar7 = a->num_bits;
        uVar14 = a->code_buffer;
        a->code_buffer = uVar14 >> 5;
        a->num_bits = iVar7 + -5;
        if (iVar7 < 10) {
          stbi__fill_bits(a);
        }
        iVar7 = a->num_bits;
        uVar8 = a->code_buffer;
        a->code_buffer = uVar8 >> 5;
        a->num_bits = iVar7 + -5;
        if (iVar7 < 9) {
          stbi__fill_bits(a);
        }
        uVar14 = uVar14 & 0x1f;
        iVar10 = uVar14 + 0x101;
        iVar18 = (uVar8 & 0x1f) + 1;
        uVar8 = a->code_buffer;
        a->code_buffer = uVar8 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        lVar19 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar9 = a->code_buffer;
          a->code_buffer = uVar9 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes_length_dezigzag)[lVar19]] = (byte)uVar9 & 7;
          lVar19 = lVar19 + 1;
        } while ((ulong)(uVar8 & 0xf) + 4 != lVar19);
        iVar7 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar7 == 0) goto LAB_001322a4;
        iVar15 = iVar18 + iVar10;
        iVar7 = 0;
        while( true ) {
          if (iVar15 <= iVar7) break;
          uVar8 = stbi__zhuffman_decode(a,&local_814);
          if (uVar8 < 0x13) {
            if ((int)uVar8 < 0x10) {
              lVar19 = (long)iVar7;
              iVar7 = iVar7 + 1;
              abStack_9e9[lVar19 + 1] = (char)uVar8;
              bVar5 = true;
            }
            else {
              iVar1 = a->num_bits;
              if (uVar8 == 0x11) {
                if (iVar1 < 3) {
                  stbi__fill_bits(a);
                }
                uVar8 = a->code_buffer;
                a->code_buffer = uVar8 >> 3;
                a->num_bits = a->num_bits + -3;
                uVar8 = (uVar8 & 7) + 3;
LAB_00132596:
                uVar9 = 0;
LAB_00132598:
                if ((int)uVar8 <= iVar15 - iVar7) {
                  memset(abStack_9e9 + (long)iVar7 + 1,uVar9,(ulong)uVar8);
                  iVar7 = iVar7 + uVar8;
                  bVar5 = true;
                  goto LAB_001325e9;
                }
                *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
              }
              else {
                if (uVar8 != 0x10) {
                  if (iVar1 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar8 = a->code_buffer;
                  a->code_buffer = uVar8 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar8 = (uVar8 & 0x7f) + 0xb;
                  goto LAB_00132596;
                }
                if (iVar1 < 2) {
                  stbi__fill_bits(a);
                }
                uVar8 = a->code_buffer;
                a->code_buffer = uVar8 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar7 != 0) {
                  uVar8 = (uVar8 & 3) + 3;
                  uVar9 = (uint)abStack_9e9[iVar7];
                  goto LAB_00132598;
                }
                *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
                iVar7 = 0;
              }
              bVar5 = false;
            }
          }
          else {
            *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
            bVar5 = false;
          }
LAB_001325e9:
          if (!bVar5) goto LAB_001322a4;
        }
        if (iVar15 != iVar7) {
          pcVar11 = "bad codelengths";
          goto LAB_0013229b;
        }
        iVar10 = stbi__zbuild_huffman(z,(stbi_uc *)((long)abStack_9e9 + 1),iVar10);
        if (iVar10 == 0) goto LAB_001322a4;
        psVar17 = asStack_8e7 + uVar14;
        break;
      case 3:
        goto switchD_0013234a_caseD_3;
      }
      iVar10 = stbi__zbuild_huffman(&a->z_distance,psVar17,iVar18);
      if (iVar10 == 0) goto LAB_001322a4;
      pcVar11 = a->zout;
      do {
        iVar10 = stbi__zhuffman_decode(a,z);
        if (iVar10 < 0x100) {
          if (iVar10 < 0) {
LAB_0013272c:
            pcVar13 = "bad huffman code";
LAB_00132733:
            *(char **)(in_FS_OFFSET + -0x10) = pcVar13;
LAB_0013273c:
            bVar5 = false;
            iVar7 = 0;
          }
          else {
            if (a->zout_end <= pcVar11) {
              iVar18 = stbi__zexpand(a,pcVar11,1);
              if (iVar18 == 0) goto LAB_0013273c;
              pcVar11 = a->zout;
            }
            *pcVar11 = (char)iVar10;
            pcVar11 = pcVar11 + 1;
            bVar5 = true;
          }
        }
        else if (iVar10 == 0x100) {
          a->zout = pcVar11;
          iVar7 = 1;
          bVar5 = false;
        }
        else {
          uVar12 = (ulong)(iVar10 - 0x101);
          uVar14 = stbi__zlength_base[uVar12];
          if (0xffffffffffffffeb < uVar12 - 0x1c) {
            uVar8 = stbi__zreceive(a,stbi__zlength_extra[uVar12]);
            uVar14 = uVar14 + uVar8;
          }
          uVar8 = stbi__zhuffman_decode(a,&a->z_distance);
          if ((int)uVar8 < 0) goto LAB_0013272c;
          uVar12 = (ulong)uVar8;
          iVar10 = stbi__zdist_base[uVar12];
          if (0xffffffffffffffe5 < uVar12 - 0x1e) {
            uVar8 = stbi__zreceive(a,stbi__zdist_extra[uVar12]);
            iVar10 = iVar10 + uVar8;
          }
          if ((long)pcVar11 - (long)a->zout_start < (long)iVar10) {
            pcVar13 = "bad dist";
            goto LAB_00132733;
          }
          if (a->zout_end < pcVar11 + (int)uVar14) {
            iVar18 = stbi__zexpand(a,pcVar11,uVar14);
            if (iVar18 == 0) goto LAB_0013273c;
            pcVar11 = a->zout;
          }
          lVar19 = -(long)iVar10;
          if (iVar10 == 1) {
            bVar5 = true;
            if (uVar14 != 0) {
              memset(pcVar11,(uint)(byte)pcVar11[lVar19],(ulong)uVar14);
              pcVar11 = pcVar11 + (ulong)(uVar14 - 1) + 1;
            }
          }
          else {
            bVar5 = true;
            for (; uVar14 != 0; uVar14 = uVar14 - 1) {
              *pcVar11 = pcVar11[lVar19];
              pcVar11 = pcVar11 + 1;
            }
          }
        }
      } while (bVar5);
      if (iVar7 == 0) {
        return 0;
      }
LAB_0013286f:
    } while ((uVar6 & 1) == 0);
    iVar18 = 1;
  }
  else {
    pbVar2 = a->zbuffer;
    pbVar3 = a->zbuffer_end;
    uVar14 = 0;
    uVar6 = 0;
    if (pbVar2 < pbVar3) {
      a->zbuffer = pbVar2 + 1;
      uVar6 = (uint)*pbVar2;
    }
    pbVar2 = a->zbuffer;
    if (pbVar2 < pbVar3) {
      a->zbuffer = pbVar2 + 1;
      uVar14 = (uint)*pbVar2;
    }
    if ((a->zbuffer < pbVar3) && ((uVar6 << 8 | uVar14) * -0x42108421 < 0x8421085)) {
      if ((uVar14 & 0x20) == 0) {
        if ((uVar6 & 0xf) == 8) goto LAB_001322d1;
        pcVar11 = "bad compression";
      }
      else {
        pcVar11 = "no preset dict";
      }
    }
    else {
      pcVar11 = "bad zlib header";
    }
LAB_0013229b:
    *(char **)(in_FS_OFFSET + -0x10) = pcVar11;
LAB_001322a4:
    iVar18 = 0;
  }
switchD_0013234a_caseD_3:
  return iVar18;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}